

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printPostIncOperand2(MCInst *MI,uint OpNo,SStream *O,int Amount)

{
  int Amount_local;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  printPostIncOperand(MI,OpNo,Amount,O);
  return;
}

Assistant:

static void printPostIncOperand2(MCInst *MI, unsigned OpNo, SStream *O, int Amount)
{
	printPostIncOperand(MI, OpNo, Amount, O);
}